

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

void Js::JavascriptArray::InternalCopyNativeIntArrayElements
               (JavascriptArray *dstArray,uint32 dstIndex,JavascriptNativeIntArray *srcArray,
               uint32 start,uint32 end)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  uint uVar4;
  undefined4 *puVar5;
  uint32 count;
  int iVar6;
  undefined1 local_50 [8];
  ArrayElementEnumerator e;
  
  e.end = dstIndex;
  if ((end <= start) ||
     ((srcArray->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.length < end))
  {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2d6d,"(start < end && end <= srcArray->length)",
                                "start < end && end <= srcArray->length");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  e.start = end;
  ArrayElementEnumerator::ArrayElementEnumerator
            ((ArrayElementEnumerator *)local_50,(JavascriptArray *)srcArray,start,end);
  if (local_50 == (undefined1  [8])0x0) {
    count = 0;
  }
  else {
    iVar6 = e.end - start;
    count = 0;
    do {
      do {
        while (e.seg._0_4_ = (uint)e.seg + 1, e.seg._4_4_ <= (uint)e.seg) {
          local_50 = (undefined1  [8])((Type *)((long)local_50 + 0x10))->ptr;
          if (local_50 == (undefined1  [8])0x0) goto LAB_00b83da1;
          uVar4 = e.endIndex - ((SparseArraySegmentBase *)local_50)->left;
          if (e.endIndex < ((SparseArraySegmentBase *)local_50)->left || uVar4 == 0) {
            local_50 = (undefined1  [8])0x0;
            goto LAB_00b83da1;
          }
          e.seg._4_4_ = ((SparseArraySegmentBase *)local_50)->length;
          if (uVar4 < ((SparseArraySegmentBase *)local_50)->length) {
            e.seg._4_4_ = uVar4;
          }
          e.seg._0_4_ = 0xffffffff;
        }
      } while ((&((SparseArraySegmentBase *)((long)local_50 + 0x18))->left)[(uint)e.seg] ==
               0xfff80002);
      uVar3 = ArrayElementEnumerator::GetIndex((ArrayElementEnumerator *)local_50);
      uVar4 = ArrayElementEnumerator::GetItem<int>((ArrayElementEnumerator *)local_50);
      DirectSetItemAt<void*>(dstArray,uVar3 + iVar6,(Var)((ulong)uVar4 | 0x1000000000000));
      count = count + 1;
    } while (local_50 != (undefined1  [8])0x0);
  }
LAB_00b83da1:
  if (count + start != e.start) {
    InternalFillFromPrototype(dstArray,e.end,(JavascriptArray *)srcArray,start,e.start,count);
  }
  return;
}

Assistant:

void JavascriptArray::InternalCopyNativeIntArrayElements(JavascriptArray* dstArray, uint32 dstIndex, JavascriptNativeIntArray* srcArray, uint32 start, uint32 end)
    {
        Assert(start < end && end <= srcArray->length);

        uint32 count = 0;

        // iterate on the array itself
        ScriptContext *scriptContext = dstArray->GetScriptContext();

        ArrayElementEnumerator e(srcArray, start, end);
        while(e.MoveNext<int32>())
        {
            uint32 n = dstIndex + (e.GetIndex() - start);
            dstArray->DirectSetItemAt(n, JavascriptNumber::ToVar(e.GetItem<int32>(), scriptContext));
            count++;
        }

        // iterate on the array's prototypes only if not all elements found
        if (start + count != end)
        {
            InternalFillFromPrototype(dstArray, dstIndex, srcArray, start, end, count);
        }
    }